

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  Type local_c [2];
  Type type_local;
  
  if (type != Void) {
    local_c[0] = type;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&this->type_stack_,local_c);
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}